

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O2

void __thiscall VGMPlayer::Cmd_DACCtrl_SetData(VGMPlayer *this)

{
  UINT8 *pUVar1;
  size_t sVar2;
  UINT8 *Data;
  UINT8 *pUVar3;
  DEV_DATA *info;
  pointer pDVar4;
  ulong uVar5;
  ulong uVar6;
  
  pUVar1 = this->_fileData;
  uVar6 = (ulong)this->_filePos;
  sVar2 = this->_dacStrmMap[pUVar1[uVar6 + 1]];
  if (sVar2 != 0xffffffffffffffff) {
    pDVar4 = (this->_dacStreams).
             super__Vector_base<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar5 = (ulong)pUVar1[uVar6 + 2];
    pDVar4[sVar2].bankID = pUVar1[uVar6 + 2];
    if (uVar5 < 0x40) {
      pDVar4 = pDVar4 + sVar2;
      pDVar4->maxItems =
           (UINT32)((ulong)((long)this->_pcmBank[uVar5].bankOfs.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)this->_pcmBank[uVar5].bankOfs.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 2);
      Data = this->_pcmBank[uVar5].data.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
      pUVar3 = this->_pcmBank[uVar5].data.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      info = (pDVar4->defInf).dataPtr;
      if (Data != pUVar3) {
        daccontrol_set_data(info,Data,(int)pUVar3 - (int)Data,pUVar1[uVar6 + 3],pUVar1[uVar6 + 4]);
        return;
      }
      daccontrol_set_data(info,(UINT8 *)0x0,0,pUVar1[uVar6 + 3],pUVar1[uVar6 + 4]);
      return;
    }
  }
  return;
}

Assistant:

void VGMPlayer::Cmd_DACCtrl_SetData(void)	// DAC Stream Control: Set Data Bank
{
	size_t dsID = _dacStrmMap[fData[0x01]];
	if (dsID == (size_t)-1)
		return;
	DACSTRM_DEV* dacStrm = &_dacStreams[dsID];
	
	dacStrm->bankID = fData[0x02];
	if (dacStrm->bankID >= _PCM_BANK_COUNT)
		return;
	PCM_BANK* pcmBnk = &_pcmBank[dacStrm->bankID];
	
	dacStrm->maxItems = (UINT32)pcmBnk->bankOfs.size();
	if (pcmBnk->data.empty())
		daccontrol_set_data(dacStrm->defInf.dataPtr, NULL, 0, fData[0x03], fData[0x04]);
	else
		daccontrol_set_data(dacStrm->defInf.dataPtr, &pcmBnk->data[0], (UINT32)pcmBnk->data.size(), fData[0x03], fData[0x04]);
	return;
}